

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuadaptor.cpp
# Opt level: O0

void __thiscall
QDBusMenuAdaptor::Event
          (QDBusMenuAdaptor *this,int id,QString *eventId,QDBusVariant *data,uint timestamp)

{
  bool bVar1;
  QDBusPlatformMenuItem *this_00;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_RDX;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  QDBusPlatformMenu *menu;
  QDBusPlatformMenuItem *item;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QDBusPlatformMenuItem *in_stack_fffffffffffffef8;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  uint uVar3;
  QMessageLogger *in_stack_ffffffffffffff10;
  bool local_e1;
  qsizetype in_stack_ffffffffffffff30;
  QPlatformMenu *pQVar4;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QDBusPlatformMenuItem::byId(in_stack_ffffffffffffff0c);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QtPrivateLogging::qLcMenu();
  anon_unknown.dwarf_1e2e9c4::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_ffffffffffffff00,(QLoggingCategory *)in_stack_fffffffffffffef8);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_1e2e9c4::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xae8cb2);
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff10,
               (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),(char *)in_stack_fffffffffffffef8,
               (char *)0xae8ccb);
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff00,
                       (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    if (this_00 == (QDBusPlatformMenuItem *)0x0) {
      QVar2 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                         (size_t)in_stack_ffffffffffffff00);
      QVar2.m_data = (char *)QVar2.m_size;
      QVar2.m_size = in_stack_ffffffffffffff30;
      QString::QString((QString *)in_stack_ffffffffffffff10,QVar2);
    }
    else {
      QDBusPlatformMenuItem::text(in_stack_fffffffffffffef8);
    }
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff10,
                       (QString *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff10,
                       (QString *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    QString::~QString((QString *)0xae8d6f);
    QDebug::~QDebug(&local_20);
    local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
  }
  local_e1 = false;
  if (this_00 != (QDBusPlatformMenuItem *)0x0) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               (size_t)in_stack_ffffffffffffff00);
    local_e1 = ::operator==((QString *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
                            ,(QLatin1StringView *)in_stack_ffffffffffffff00);
  }
  if (local_e1 != false) {
    QDBusPlatformMenuItem::trigger((QDBusPlatformMenuItem *)0xae8dec);
  }
  uVar3 = in_stack_ffffffffffffff0c & 0xffffff;
  if (this_00 != (QDBusPlatformMenuItem *)0x0) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)(CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08) &
                       0xffffffffffffff),(size_t)in_RDX);
    bVar1 = ::operator==((QString *)CONCAT44(uVar3,in_stack_ffffffffffffff08),
                         (QLatin1StringView *)in_RDX);
    uVar3 = CONCAT13(bVar1,(int3)uVar3);
    in_stack_ffffffffffffff00 = in_RDX;
  }
  if ((char)(uVar3 >> 0x18) != '\0') {
    QPlatformMenuItem::hovered((QPlatformMenuItem *)0xae8e4f);
  }
  Qt::Literals::StringLiterals::operator____L1
            ((char *)CONCAT44(uVar3,in_stack_ffffffffffffff08),(size_t)in_stack_ffffffffffffff00);
  bVar1 = ::operator==((QString *)CONCAT44(uVar3,in_stack_ffffffffffffff08),
                       (QLatin1StringView *)in_stack_ffffffffffffff00);
  if (bVar1) {
    pQVar4 = (QPlatformMenu *)0x0;
    if (this_00 == (QDBusPlatformMenuItem *)0x0) {
      if (in_ESI == 0) {
        pQVar4 = *(QPlatformMenu **)(in_RDI + 0x10);
      }
    }
    else {
      pQVar4 = QDBusPlatformMenuItem::menu((QDBusPlatformMenuItem *)this_00);
    }
    if (pQVar4 != (QPlatformMenu *)0x0) {
      QPlatformMenu::aboutToHide((QPlatformMenu *)0xae8edb);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDBusMenuAdaptor::Event(int id, const QString &eventId, const QDBusVariant &data, uint timestamp)
{
    Q_UNUSED(data);
    Q_UNUSED(timestamp);
    QDBusPlatformMenuItem *item = QDBusPlatformMenuItem::byId(id);
    qCDebug(qLcMenu) << id << (item ? item->text() : ""_L1) << eventId;
    if (item && eventId == "clicked"_L1)
        item->trigger();
    if (item && eventId == "hovered"_L1)
        emit item->hovered();
    if (eventId == "closed"_L1) {
        // There is no explicit AboutToHide method, so map closed event to aboutToHide method
        const QDBusPlatformMenu *menu = nullptr;
        if (item)
            menu = static_cast<const QDBusPlatformMenu *>(item->menu());
        else if (id == 0)
            menu = m_topLevelMenu;
        if (menu)
            emit const_cast<QDBusPlatformMenu *>(menu)->aboutToHide();
    }
}